

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O3

void __thiscall
CTcParser::parse_obj_prop
          (CTcParser *this,int *err,CTPNObjDef *objdef,int replace,CTcSymMetaclass *meta_sym,
          tcprs_term_info *term_info,propset_def *propset_stack,int propset_depth,int obj_is_nested,
          int is_inline)

{
  undefined1 *puVar1;
  ushort prop;
  CTPNObjProp *pCVar2;
  int *piVar3;
  tcprs_term_info *ptVar4;
  wchar_t wVar5;
  wchar_t ch;
  tc_toktyp_t tVar6;
  int iVar7;
  CTcToken *pCVar8;
  size_t sVar9;
  CTcSymProp *pCVar10;
  CTcSymProp *prop_00;
  CTcPrsNodeBase *expr;
  CTPNAnonFunc *inline_method_00;
  CTPNCodeBody *code_body;
  CTcSymMetaProp *pCVar11;
  CTcDictPropEntry *pCVar12;
  propset_def *ppVar13;
  CTcPrsNodeBase *pCVar14;
  CTcPrsNode *expr_00;
  ulong uVar15;
  uint is_static;
  CTcSymMetaclass *cur_meta;
  CTcSymObjBase *this_00;
  byte *__n;
  void *__dest;
  byte *pbVar16;
  byte *p;
  size_t __n_00;
  bool bVar17;
  CTPNObjProp *new_prop;
  CTPNAnonFunc *inline_method;
  int op_args;
  CTcToken prop_tok;
  int opt_argc;
  int has_retval;
  int varargs_list;
  char tmpbuf [80];
  char expbuf [80];
  CTPNObjProp *local_170;
  CTPNAnonFunc *local_168;
  int local_15c;
  int *local_158;
  CTcSymMetaclass *local_150;
  CTcToken local_148;
  tcprs_term_info *local_120;
  propset_def *local_118;
  CTcPrsNodeBase *local_110;
  CTcParser *local_108;
  byte *local_100;
  ulong local_f8;
  int local_f0;
  int local_ec;
  CTcPrsNodeBase local_e8 [10];
  CTcPrsPropExprSave local_98;
  
  local_170 = (CTPNObjProp *)0x0;
  local_158 = err;
  local_120 = term_info;
  pCVar8 = CTcTokenizer::copycur(G_tok);
  local_148.typ_ = pCVar8->typ_;
  local_148._4_4_ = *(undefined4 *)&pCVar8->field_0x4;
  local_148.text_ = pCVar8->text_;
  local_148.text_len_ = pCVar8->text_len_;
  local_148.int_val_._0_4_ = (undefined4)pCVar8->int_val_;
  local_148.int_val_._4_4_ = *(undefined4 *)((long)&pCVar8->int_val_ + 4);
  local_148._32_8_ = *(undefined8 *)&pCVar8->field_0x20;
  if (propset_depth != 0) {
    local_150 = meta_sym;
    if (local_148.typ_ == TOKT_OPERATOR) {
      CTcTokenizer::log_error(0x2bd6);
    }
    __n_00 = (G_tok->curtok_).text_len_;
    local_108 = this;
    memcpy(&local_98,(G_tok->curtok_).text_,__n_00);
    if (0 < propset_depth) {
      uVar15 = 10;
      if ((uint)propset_depth < 10) {
        uVar15 = (ulong)(uint)propset_depth;
      }
      ppVar13 = propset_stack + uVar15;
      do {
        __n = (byte *)ppVar13[-1].prop_pattern_len;
        if ((byte *)0x50 < __n + __n_00) {
          CTcTokenizer::log_error(0x2bb8);
          break;
        }
        local_118 = ppVar13 + -1;
        pCVar14 = local_e8;
        local_f8 = uVar15;
        if (__n != (byte *)0x0) {
          pCVar14 = local_e8;
          p = (byte *)local_118->prop_pattern;
          do {
            wVar5 = utf8_ptr::s_getch((char *)p);
            ch = utf8_ptr::s_getch((char *)p);
            if (wVar5 == L'*') {
              if (ch == L'*') {
                local_100 = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
                memcpy(pCVar14,&local_98,__n_00);
                pbVar16 = (byte *)((long)&pCVar14->_vptr_CTcPrsNodeBase + __n_00);
                __n = p + ((long)__n - (long)local_100);
                p = local_100;
                if (__n == (byte *)0x0) goto LAB_002389f1;
              }
              else {
                memcpy(pCVar14,&local_98,__n_00);
              }
              __dest = (void *)((long)&pCVar14->_vptr_CTcPrsNodeBase + __n_00);
              memcpy(__dest,p,(size_t)__n);
              pbVar16 = (byte *)((long)__dest + (long)__n);
              goto LAB_002389f1;
            }
            sVar9 = utf8_ptr::s_putch((char *)pCVar14,ch);
            pCVar14 = (CTcPrsNodeBase *)((long)&pCVar14->_vptr_CTcPrsNodeBase + sVar9);
            __n = p + ((long)__n -
                      (long)(p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1));
            p = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
          } while (__n != (byte *)0x0);
        }
        memcpy(pCVar14,&local_98,__n_00);
        pbVar16 = (byte *)((long)&pCVar14->_vptr_CTcPrsNodeBase + __n_00);
LAB_002389f1:
        __n_00 = (long)pbVar16 - (long)local_e8;
        memcpy(&local_98,local_e8,__n_00);
        uVar15 = (ulong)((int)local_f8 - 1);
        ppVar13 = local_118;
      } while (1 < (int)local_f8);
    }
    local_148.text_ = CTcTokenizer::store_source(G_tok,(char *)&local_98,__n_00);
    meta_sym = local_150;
    this = local_108;
    local_148.text_len_ = __n_00;
  }
  local_15c = 0;
  if (local_148.typ_ == TOKT_OPERATOR) {
    parse_op_name(this,&local_148,&local_15c);
  }
  pCVar14 = (CTcPrsNodeBase *)0x0;
  pCVar10 = (CTcSymProp *)
            CTcPrsSymtab::find(this->global_symtab_,local_148.text_,local_148.text_len_,
                               (CTcPrsSymtab **)0x0);
  tVar6 = CTcTokenizer::next(G_tok);
  ptVar4 = local_120;
  if ((int)tVar6 < 0x1a) {
    if ((int)tVar6 < 0x17) {
      pCVar14 = (CTcPrsNodeBase *)(ulong)(tVar6 - TOKT_RPAR);
      if (tVar6 - TOKT_RPAR < 2) {
LAB_00238b44:
        prop_00 = (CTcSymProp *)0x0;
        CTcTokenizer::log_error
                  (0x2b64,local_148.text_len_ & 0xffffffff,local_148.text_,
                   (ulong)(uint)(G_tok->curtok_).text_len_,(G_tok->curtok_).text_);
        if ((G_tok->curtok_).typ_ == TOKT_SEM) goto LAB_00238fd1;
        CTcTokenizer::next(G_tok);
        goto LAB_00238b88;
      }
      if (tVar6 != TOKT_LPAR) {
LAB_00238b9d:
        CTcTokenizer::log_error_curtok(G_tok,0x2b6d);
        goto LAB_00238bab;
      }
    }
    else if (tVar6 != TOKT_LBRACE) {
      if (tVar6 != TOKT_RBRACE) goto LAB_00238b9d;
      goto LAB_00238b44;
    }
LAB_00238c58:
    prop_00 = look_up_prop(this,&local_148,1);
    if ((prop_00 != (CTcSymProp *)0x0) && (((prop_00->super_CTcSymPropBase).field_0x2a & 2) != 0)) {
      CTcTokenizer::log_error_curtok(G_tok,0x2b7b);
    }
    piVar3 = local_158;
    if (is_inline == 0) {
      expr_00 = (CTcPrsNode *)0x1;
      code_body = parse_code_body(this,0,1,1,(int *)local_e8,(int *)&local_110,(int *)&local_168,
                                  &local_ec,(CTcSymLocal **)&local_98,&local_f0,local_158,
                                  (CTcPrsSymtab *)0x0,TCPRS_CB_NORMAL,propset_stack,propset_depth,
                                  (CTcCodeBodyRef *)0x0,(CTcFormalTypeList **)0x0);
      if (*piVar3 != 0) {
        return;
      }
      if (local_15c != 0) {
        if (code_body != (CTPNCodeBody *)0x0) {
          puVar1 = &(code_body->super_CTPNCodeBodyBase).field_0xb9;
          *puVar1 = *puVar1 | 2;
        }
        if (((int)local_168 != 0) || ((int)local_e8[0]._vptr_CTcPrsNodeBase != local_15c + -1)) {
          CTcTokenizer::log_error(0x2bd9,(ulong)(local_15c - 1));
        }
      }
      if (prop_00 != (CTcSymProp *)0x0) {
        local_170 = CTPNObjDef::add_method(objdef,prop_00,code_body,expr_00,replace);
      }
    }
    else {
      CTcTokenizer::unget(G_tok);
      inline_method_00 = CTcPrsOpUnary::parse_anon_func(0,1);
      if (inline_method_00 != (CTPNAnonFunc *)0x0) {
        local_170 = CTPNObjDef::add_inline_method
                              (objdef,prop_00,inline_method_00,(CTcPrsNode *)0x0,replace);
      }
    }
    goto LAB_00238fd1;
  }
  if (0x28 < (int)tVar6) {
    if (tVar6 != TOKT_COLON) {
      if (tVar6 != TOKT_SEM) goto LAB_00238b9d;
      goto LAB_00238b44;
    }
    if ((pCVar10 != (CTcSymProp *)0x0) &&
       (*(int *)&((CVmHashEntry *)
                 &(pCVar10->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase)->field_0x24
        == 2)) {
      CTcMain::log_error(G_tcmain,local_120->desc_,local_120->linenum_,TC_SEV_ERROR,0x2baf);
      CTcTokenizer::unget(G_tok);
      ptVar4->unterm_ = 1;
      return;
    }
    CTcTokenizer::next(G_tok);
    iVar7 = (*objdef->_vptr_CTPNObjDef[1])
                      (objdef,&local_170,local_158,local_120,&local_148,(ulong)(uint)replace);
    if (iVar7 == 0) {
      return;
    }
LAB_00238b88:
    prop_00 = (CTcSymProp *)0x0;
    goto LAB_00238fd1;
  }
  if (tVar6 == TOKT_RBRACK) goto LAB_00238b44;
  if (tVar6 != TOKT_EQ) goto LAB_00238b9d;
  CTcTokenizer::next(G_tok);
  if ((G_tok->curtok_).typ_ == TOKT_LBRACE) {
    CTcTokenizer::log_error(0x2b20);
    goto LAB_00238c58;
  }
LAB_00238bab:
  pCVar8 = &local_148;
  prop_00 = look_up_prop(this,pCVar8,1);
  local_150 = meta_sym;
  if (prop_00 == (CTcSymProp *)0x0) {
    local_e8[0]._vptr_CTcPrsNodeBase = (_func_int **)0x0;
    local_168 = (CTPNAnonFunc *)0x0;
LAB_00238e5a:
    bVar17 = (G_tok->curtok_).typ_ == TOKT_STATIC;
    if (bVar17) {
      CTcTokenizer::next(G_tok);
    }
    is_static = (uint)bVar17;
    begin_prop_expr(this,&local_98,is_static,is_inline);
    expr = &parse_expr_or_dstr(this,1)->super_CTcPrsNodeBase;
    if (expr == (CTcPrsNodeBase *)0x0) {
      *local_158 = 1;
      return;
    }
    pCVar14 = local_e8;
    local_110 = expr;
    finish_prop_expr(this,&local_98,(CTcPrsNode **)&local_110,(CTPNCodeBody **)pCVar14,&local_168,
                     is_static,is_inline,prop_00);
  }
  else {
    local_e8[0]._vptr_CTcPrsNodeBase = (_func_int **)0x0;
    local_168 = (CTPNAnonFunc *)0x0;
    if (((prop_00->super_CTcSymPropBase).field_0x2a & 2) == 0) goto LAB_00238e5a;
    if ((G_tok->curtok_).typ_ != TOKT_SSTR) {
      CTcTokenizer::log_error_curtok(G_tok,0x2b7b);
      goto LAB_00238e5a;
    }
    expr = (CTcPrsNodeBase *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)pCVar8);
    *(undefined4 *)&((CTcPrsNodeBase *)&expr[1]._vptr_CTcPrsNodeBase)->_vptr_CTcPrsNodeBase = 10;
    *(undefined1 *)&((CTcPrsNodeBase *)&expr[5]._vptr_CTcPrsNodeBase)->_vptr_CTcPrsNodeBase = 0;
    ((CTcPrsNodeBase *)&expr->_vptr_CTcPrsNodeBase)->_vptr_CTcPrsNodeBase =
         (_func_int **)&PTR_gen_code_00357758;
    if (this->dict_cur_ == (CTcDictEntry *)0x0) {
      CTcTokenizer::log_error(0x2b7c);
    }
    if (objdef == (CTPNObjDef *)0x0) {
      this_00 = (CTcSymObjBase *)0x0;
    }
    else {
      this_00 = &objdef->obj_sym_->super_CTcSymObjBase;
    }
    do {
      if (this_00 != (CTcSymObjBase *)0x0) {
        prop = (prop_00->super_CTcSymPropBase).prop_;
        pCVar14 = (CTcPrsNodeBase *)(ulong)prop;
        CTcSymObjBase::add_vocab_word
                  (this_00,(G_tok->curtok_).text_,(G_tok->curtok_).text_len_,prop);
      }
      tVar6 = CTcTokenizer::next(G_tok);
    } while (tVar6 == TOKT_SSTR);
    is_static = 0;
  }
  meta_sym = local_150;
  if (prop_00 != (CTcSymProp *)0x0) {
    if ((CTPNCodeBody *)local_e8[0]._vptr_CTcPrsNodeBase == (CTPNCodeBody *)0x0) {
      if (local_168 == (CTPNAnonFunc *)0x0) {
        local_170 = CTPNObjDef::add_prop(objdef,prop_00,(CTcPrsNode *)expr,replace,is_static);
        meta_sym = local_150;
      }
      else {
        local_170 = CTPNObjDef::add_inline_method
                              (objdef,prop_00,local_168,(CTcPrsNode *)expr,replace);
        meta_sym = local_150;
      }
    }
    else {
      local_170 = CTPNObjDef::add_method
                            (objdef,prop_00,(CTPNCodeBody *)local_e8[0]._vptr_CTcPrsNodeBase,
                             (CTcPrsNode *)pCVar14,replace);
      meta_sym = local_150;
    }
  }
LAB_00238fd1:
  if (pCVar10 != (CTcSymProp *)0x0) {
    if ((obj_is_nested == 0) || (pCVar10 != this->lexical_parent_sym_)) {
      for (pCVar2 = (objdef->proplist_).first_; pCVar2 != (CTPNObjProp *)0x0;
          pCVar2 = (pCVar2->super_CTPNObjPropBase).nxt_) {
        if ((pCVar2 != local_170) && ((pCVar2->super_CTPNObjPropBase).prop_sym_ == pCVar10)) {
          if (((pCVar2->super_CTPNObjPropBase).field_0x58 & 2) == 0) goto LAB_00238fe9;
          (*objdef->_vptr_CTPNObjDef[2])();
          break;
        }
      }
    }
    else {
LAB_00238fe9:
      CTcTokenizer::log_error
                (0x2b6c,(ulong)(uint)((CVmHashEntry *)
                                     &(pCVar10->super_CTcSymPropBase).super_CTcSymbol.
                                      super_CTcSymbolBase)->len_,
                 ((CVmHashEntry *)
                 &(pCVar10->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase)->str_);
    }
  }
  if (prop_00 != (CTcSymProp *)0x0 && meta_sym != (CTcSymMetaclass *)0x0) {
    do {
      for (pCVar11 = (meta_sym->super_CTcSymMetaclassBase).prop_head_;
          pCVar11 != (CTcSymMetaProp *)0x0; pCVar11 = pCVar11->nxt_) {
        if (pCVar11->prop_ == prop_00) {
          CTcTokenizer::log_error
                    (0x2d17,(prop_00->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                            super_CVmHashEntryCS.super_CVmHashEntry.len_,
                     (prop_00->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                     super_CVmHashEntryCS.super_CVmHashEntry.str_);
          break;
        }
      }
      meta_sym = (meta_sym->super_CTcSymMetaclassBase).super_meta_;
    } while (meta_sym != (CTcSymMetaclass *)0x0);
  }
  if ((prop_00 != (CTcSymProp *)0x0) &&
     (pCVar12 = this->dict_prop_head_,
     pCVar12 != (CTcDictPropEntry *)0x0 && ((prop_00->super_CTcSymPropBase).field_0x2a & 2) != 0)) {
    do {
      if (*(CTcSymProp **)pCVar12 == prop_00) {
        pCVar12[0x10] = (CTcDictPropEntry)((byte)pCVar12[0x10] | 1);
        return;
      }
      pCVar12 = *(CTcDictPropEntry **)(pCVar12 + 8);
    } while (pCVar12 != (CTcDictPropEntry *)0x0);
  }
  return;
}

Assistant:

void CTcParser::parse_obj_prop(
    int *err, CTPNObjDef *objdef, int replace, CTcSymMetaclass *meta_sym,
    tcprs_term_info *term_info, propset_def *propset_stack, int propset_depth,
    int obj_is_nested, int is_inline)
{
    /* we haven't created the new property yet */
    CTPNObjProp *new_prop = 0;

    /* presume it's not a static property definition */
    int is_static = FALSE;
    
    /* remember the property token */
    CTcToken prop_tok = *G_tok->copycur();

    /* 
     *   if we're in a property set, apply the property set pattern to the
     *   property name 
     */
    if (propset_depth != 0)
    {
        /* we can't define operator overloads here */
        if (prop_tok.gettyp() == TOKT_OPERATOR)
            G_tok->log_error(TCERR_OPER_IN_PROPSET);
        
        /*
         *   Build the real property name based on all enclosing propertyset
         *   pattern strings.  Start with the current (innermost) pattern,
         *   then apply the next pattern out, and so on.
         *   
         *   Note that if the current nesting depth is greater than the
         *   maximum nesting depth, ignore the illegally deep levels and
         *   just start with the deepest legal level.  
         */
        int i = propset_depth;
		if (i > (int)MAX_PROPSET_DEPTH)
            i = MAX_PROPSET_DEPTH;
        
        /* start with the current token */
        size_t explen = G_tok->getcur()->get_text_len();
        char expbuf[TOK_SYM_MAX_LEN];
        memcpy(expbuf, G_tok->getcur()->get_text(), explen);
        
        /* iterate through the propertyset stack */
        for (propset_def *cur = &propset_stack[i-1] ; i > 0 ; --i, --cur)
        {
            char tmpbuf[TOK_SYM_MAX_LEN];
            utf8_ptr src;
            utf8_ptr dst;
            size_t rem;

            /* if we'd exceed the maximum token length, stop here */
            if (explen + cur->prop_pattern_len > TOK_SYM_MAX_LEN)
            {
                /* complain about it */
                G_tok->log_error(TCERR_PROPSET_TOK_TOO_LONG);
                
                /* stop the expansion */
                break;
            }
            
            /* copy the pattern up to the '*' */
            for (src.set((char *)cur->prop_pattern),
                 dst.set(tmpbuf), rem = cur->prop_pattern_len ;
                 rem != 0 && src.getch() != '*' ; src.inc(&rem))
            {
                /* copy this character */
                dst.setch(src.getch());
            }
            
            /* if we found a '*', skip it */
            if (rem != 0 && src.getch() == '*')
                src.inc(&rem);
            
            /* insert the expansion from the last round here */
            memcpy(dst.getptr(), expbuf, explen);
            
            /* advance our output pointer */
            dst.set(dst.getptr() + explen);
            
            /* copy the remainder of the pattern string */
            if (rem != 0)
            {
                /* copy the remaining bytes */
                memcpy(dst.getptr(), src.getptr(), rem);

                /* advance the output pointer past the copied bytes */
                dst.set(dst.getptr() + rem);
            }
            
            /* copy the result back to the expansion buffer */
            explen = dst.getptr() - tmpbuf;
            memcpy(expbuf, tmpbuf, explen);
        }

        /* store the new token in tokenizer memory */
        prop_tok.set_text(G_tok->store_source(expbuf, explen), explen);
    }

    /* presume we won't find a valid symbol for the property token */
    CTcSymProp *prop_sym = 0;

    /* presume it's not an operator overload property */
    int op_args = 0;

    /* if this is an 'operator' property, the syntax is special */
    if (prop_tok.gettyp() == TOKT_OPERATOR)
        parse_op_name(&prop_tok, &op_args);

    /* 
     *   look up the property token as a symbol, to see if it's already
     *   defined - we don't want to presume it's a property quite yet, but
     *   we can at least look to see if it's defined as something else 
     */
    CTcSymbol *sym = global_symtab_->find(
        prop_tok.get_text(), prop_tok.get_text_len());

    /* skip it and see what comes next */
    switch (G_tok->next())
    {
    case TOKT_LPAR:
    case TOKT_LBRACE:
    parse_method:
        /* look up the symbol */
        prop_sym = look_up_prop(&prop_tok, TRUE);

        /* vocabulary properties can't be code */
        if (prop_sym != 0 && prop_sym->is_vocab())
            G_tok->log_error_curtok(TCERR_VOCAB_REQ_SSTR);

        /* 
         *   A left paren starts a formal parameter list, a left brace starts
         *   a code body - in either case, we have a method, so parse the
         *   code body.  If we're parsing an inline object definition, parse
         *   it as an anonymous method definition instead.
         */
        if (is_inline)
        {
            /* inline object - parse an anonymous method */
            G_tok->unget();
            CTPNAnonFunc *m = CTcPrsOpUnary::parse_anon_func(FALSE, TRUE);

            /* add this as a property expression */
            if (m != 0)
                new_prop = objdef->add_inline_method(prop_sym, m, 0, replace);
        }
        else
        {
            /* top-level object - parse a code body */
            int argc;
            int opt_argc;
            int varargs;
            int varargs_list;
            CTcSymLocal *varargs_list_local;
            int has_retval;
            CTPNCodeBody *code_body = parse_code_body(
                FALSE, TRUE, TRUE, &argc, &opt_argc, &varargs,
                &varargs_list, &varargs_list_local, &has_retval, err, 0,
                TCPRS_CB_NORMAL, propset_stack, propset_depth, 0, 0);

            /* check for errors in the code body */
            if (*err)
                return;

            /* 
             *   if this is an operator, check arguments, and pick the
             *   correct operator for the number of operands for operators
             *   with multiple operand numbers 
             */
            if (op_args != 0)
            {
                /* mark the code body as an operator overload method */
                if (code_body != 0)
                    code_body->set_operator_overload(TRUE);
                
                /* varargs aren't allowed */
                if (varargs)
                {
                    G_tok->log_error(
                        TCERR_OP_OVERLOAD_WRONG_FORMALS, op_args - 1);
                }
                else if (argc != op_args - 1)
                {
                    /* not a valid combination of operator and arguments */
                    G_tok->log_error(
                        TCERR_OP_OVERLOAD_WRONG_FORMALS, op_args - 1);
                }
            }
            
            /* add the method definition */
            if (prop_sym != 0)
                new_prop = objdef->add_method(prop_sym, code_body, 0, replace);
        }
        break;

    case TOKT_SEM:
    case TOKT_RBRACE:
    case TOKT_RPAR:
    case TOKT_RBRACK:
    case TOKT_COMMA:
        /* log the error */
        G_tok->log_error(TCERR_OBJDEF_REQ_PROPVAL,
                         (int)prop_tok.get_text_len(), prop_tok.get_text(),
                         (int)G_tok->getcur()->get_text_len(),
                         G_tok->getcur()->get_text());

        /* if it's anything other than a semicolon, skip it */
        if (G_tok->cur() != TOKT_SEM)
            G_tok->next();
        break;

    case TOKT_COLON:
        /*
         *   It's a nested object definition.  The value of the property is a
         *   reference to an anonymous object defined in-line after the
         *   colon.  The in-line object definition uses the "braces" version
         *   of the standard syntax: after the colon we have the class list,
         *   an open brace, the property list, and a close brace.
         *   
         *   Note that we hold off defining the property symbol for as long
         *   as possible, since we want to make sure that we don't have a
         *   syntax error where this was intended to be a whole new top-level
         *   object definition, but the terminator was accidentally left off
         *   the previous object.  In this case, the new object definition
         *   would look like a nested object rather than a new top-level
         *   object.  This is probably the case if the symbol before the
         *   colon is already known as an object name.
         */
        {
            /* 
             *   If the symbol before the colon is already known as an object
             *   name, it must be intended as a new object rather than a
             *   nested object, meaning that the terminator is missing from
             *   the previous object definition.  If this is the case, flag
             *   the termination error and proceed to parse the new object
             *   definition.  
             */
            if (sym != 0 && sym->get_type() == TC_SYM_OBJ)
            {
                /* 
                 *   flag the unterminated object error - note that the
                 *   location where termination should have occurred is
                 *   where the caller tells us 
                 */
                G_tcmain->log_error(term_info->desc_, term_info->linenum_,
                                    TC_SEV_ERROR, TCERR_UNTERM_OBJ_DEF);

                /* unget the colon so we can parse the new object def */
                G_tok->unget();

                /* flag the termination error for the caller */
                term_info->unterm_ = TRUE;

                /* we're done */
                return;
            }

            /* skip the colon */
            G_tok->next();

            /* parse the nested object property */
            if (!objdef->parse_nested_obj_prop(
                new_prop, err, term_info, &prop_tok, replace))
                return;
        }
        
        /* done */
        break;

    case TOKT_EQ:
        /* skip the '=' */
        G_tok->next();

        /* 
         *   if a brace follows, this must be using the obsolete TADS 2
         *   notation, in which an equals sign followed a property name even
         *   if a method was being defined; if this is the case, generate an
         *   error, but then proceed to treat what follows as a method 
         */
        if (G_tok->cur() == TOKT_LBRACE)
        {
            /* log the error... */
            G_tok->log_error(TCERR_EQ_WITH_METHOD_OBSOLETE);

            /* ...but then go ahead and parse it as a method anyway */
            goto parse_method;
        }

        /* go parse the value */
        goto parse_value;

    default:
        /* 
         *   an '=' is required after a value property name; log the error
         *   and proceed, assuming that the '=' was left out but that the
         *   property value is otherwise well-formed 
         */
        G_tok->log_error_curtok(TCERR_PROP_REQ_EQ);

    parse_value:
        {
            /* look up the property symbol */
            prop_sym = look_up_prop(&prop_tok, TRUE);

            /* note if it's a vocabulary property */
            int is_vocab_prop = (prop_sym != 0 && prop_sym->is_vocab());

            /* we don't know whether we have a constant or method yet */
            CTPNCodeBody *code_body = 0;
            CTcPrsNode *expr = 0;
            CTPNAnonFunc *inline_method = 0;

            /* 
             *   if this is a vocabulary property, perform special vocabulary
             *   list parsing - a vocabulary property can have one or more
             *   single-quoted strings that we store in a list, but the list
             *   does not have to be enclosed in brackets 
             */
            if (is_vocab_prop && G_tok->cur() == TOKT_SSTR)
            {
                /* 
                 *   set the property to a vocab list placeholder for now in
                 *   the object - we'll replace it during linking with the
                 *   actual vocabulary list
                 */
                CTcConstVal cval;
                cval.set_vocab_list();
                expr = new CTPNConst(&cval);
                
                /* if I have no dictionary, it's an error */
                if (dict_cur_ == 0)
                    G_tok->log_error(TCERR_VOCAB_NO_DICT);
                
                /* get the object symbol */
                CTcSymObj *obj_sym = (objdef != 0 ? objdef->get_obj_sym() : 0);
                
                /* parse the list entries */
                for (;;)
                {
                    /* add the word to our vocabulary list */
                    if (obj_sym != 0)
                        obj_sym->add_vocab_word(
                            G_tok->getcur()->get_text(),
                            G_tok->getcur()->get_text_len(),
                            prop_sym->get_prop());
                    
                    /* 
                     *   skip the string; if another string doesn't
                     *   immediately follow, we're done with the implied list
                     *   
                     */
                    if (G_tok->next() != TOKT_SSTR)
                        break;
                }
            }
            else
            {
                /* if it's a vocabulary property, other types aren't allowed */
                if (is_vocab_prop)
                    G_tok->log_error_curtok(TCERR_VOCAB_REQ_SSTR);
                
                /* check for the 'static' keyword */
                if (G_tok->cur() == TOKT_STATIC)
                {
                    /* note that it's static */
                    is_static = TRUE;

                    /* skip the 'static' keyword */
                    G_tok->next();
                }
                
                /* prepare to parse the property value expression */
                CTcPrsPropExprSave save_info;
                begin_prop_expr(&save_info, is_static, is_inline);
                
                /* 
                 *   parse the expression (which can be a double-quoted
                 *   string instead of a value expression) 
                 */
                expr = parse_expr_or_dstr(TRUE);
                if (expr == 0)
                {
                    *err = TRUE;
                    return;
                }
                
                /* 
                 *   finish the expression, and check to see if it needs
                 *   dynamic evaluation (if so, it will yield a code body)
                 */
                finish_prop_expr(
                    &save_info, expr, code_body, inline_method,
                    is_static, is_inline, prop_sym);
            }

            /* if we have a valid property and expression, add it */
            if (prop_sym != 0)
            {
                /* add the expression or code body, as appropriate */
                if (code_body != 0)
                {
                    /* method */
                    new_prop = objdef->add_method(
                        prop_sym, code_body, expr, replace);
                }
                else if (inline_method != 0)
                {
                    /* inline method */
                    new_prop = objdef->add_inline_method(
                        prop_sym, inline_method, expr, replace);
                }
                else if (expr != 0)
                {
                    /* constant expression */
                    new_prop = objdef->add_prop(
                        prop_sym, expr, replace, is_static);
                }
            }
        }
        
        /* done with the property */
        break;
    }

    /* make sure that the object doesn't already define this propery */
    if (sym != 0)
    {
        /* presume it's not a duplicate */
        int is_dup = FALSE;

        /* 
         *   if the enclosing object is nested, and this is the lexicalParent
         *   property, then it's defined automatically by the compiler and
         *   thus can't be redefined explicitly 
         */
        if (obj_is_nested && sym == lexical_parent_sym_)
            is_dup = TRUE;

        /* if we didn't already find a duplicate, scan the existing list */
        if (!is_dup)
        {
            /* scan the property list for this object */
            for (CTPNObjProp *obj_prop = objdef->get_first_prop() ;
                 obj_prop != 0 ; obj_prop = obj_prop->get_next_prop())
            {
                /* 
                 *   if it matches (and it's not the one we just added), log
                 *   an error 
                 */
                if (obj_prop != new_prop && obj_prop->get_prop_sym() == sym)
                {
                    /* 
                     *   if this property is overwritable, we're allowed to
                     *   replace it with a new value; otherwise, it's an
                     *   illegal duplicate 
                     */
                    if (obj_prop->is_overwritable())
                    {
                        /* 
                         *   we're allowed to overwrite it with an explicit
                         *   redefinition; simply remove the old property
                         *   from the list so we can add the new one 
                         */
                        objdef->delete_property(obj_prop->get_prop_sym());
                    }
                    else
                    {
                        /* note that we found a duplicate property */
                        is_dup = TRUE;
                    }

                    /* no need to continue looking */
                    break;
                }
            }
        }

        /* if we found a duplicate, log an error */
        if (is_dup)
            G_tok->log_error(TCERR_PROP_REDEF_IN_OBJ,
                             (int)sym->get_sym_len(), sym->get_sym());
    }

    /* 
     *   if we're modifying an intrinsic class, make sure the property isn't
     *   defined in the class's native interface 
     */
    if (meta_sym != 0 && prop_sym != 0)
    {
        /* check this intrinsic class and all of its superclasses */
        for (CTcSymMetaclass *cur_meta = meta_sym ; cur_meta != 0 ;
             cur_meta = cur_meta->get_super_meta())
        {
            /* scan the list of native methods */
            for (CTcSymMetaProp *mprop = cur_meta->get_prop_head() ;
                 mprop != 0 ; mprop = mprop->nxt_)
            {
                /* if it matches, flag an error */
                if (mprop->prop_ == prop_sym)
                {
                    /* log the error */
                    G_tok->log_error(TCERR_CANNOT_MOD_META_PROP,
                                     prop_sym->get_sym_len(),
                                     prop_sym->get_sym());
                    
                    /* no need to look any further */
                    break;
                }
            }
        }
    }

    /* 
     *   if this is a dictionary property, note that it's been defined for
     *   this object 
     */
    if (prop_sym != 0 && prop_sym->is_vocab())
    {
        /* scan the list of dictionary properties for this one */
        for (CTcDictPropEntry *entry = dict_prop_head_ ; entry != 0 ;
             entry = entry->nxt_)
        {
            /* check this one for a match */
            if (entry->prop_ == prop_sym)
            {
                /* mark this entry as defined for this object */
                entry->defined_ = TRUE;

                /* no need to look any further */
                break;
            }
        }
    }
}